

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void fe4_sub(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  fiat_uint1 local_d9;
  uint64_t uStack_d8;
  fiat_uint1 x24;
  uint64_t x23;
  uint64_t x22;
  uint64_t uStack_c0;
  fiat_uint1 x21;
  uint64_t x20;
  uint64_t uStack_b0;
  fiat_uint1 x19;
  uint64_t x18;
  uint64_t uStack_a0;
  fiat_uint1 x17;
  uint64_t x16;
  uint64_t uStack_90;
  fiat_uint1 x15;
  uint64_t x14;
  uint64_t x13;
  uint64_t uStack_78;
  fiat_uint1 x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t uStack_60;
  fiat_uint1 x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t uStack_48;
  fiat_uint1 x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t uStack_30;
  fiat_uint1 x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t *arg2_local;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  x2 = *arg2;
  x1 = (uint64_t)arg2;
  arg2_local = arg1;
  arg1_local = out1;
  fiat_subborrowx_u64(&stack0xffffffffffffffd0,(fiat_uint1 *)((long)&x4 + 7),'\0',*arg1,x2);
  x5 = *(uint64_t *)(x1 + 8);
  fiat_subborrowx_u64(&stack0xffffffffffffffb8,(fiat_uint1 *)((long)&x7 + 7),x4._7_1_,arg2_local[1],
                      x5);
  x8 = *(uint64_t *)(x1 + 0x10);
  fiat_subborrowx_u64(&stack0xffffffffffffffa0,(fiat_uint1 *)((long)&x10 + 7),x7._7_1_,arg2_local[2]
                      ,x8);
  x11 = *(uint64_t *)(x1 + 0x18);
  fiat_subborrowx_u64(&stack0xffffffffffffff88,(fiat_uint1 *)((long)&x13 + 7),x10._7_1_,
                      arg2_local[3],x11);
  fiat_cmovznz_u64(&x14,x13._7_1_,0,0x26);
  fiat_subborrowx_u64(&stack0xffffffffffffff70,(fiat_uint1 *)((long)&x16 + 7),'\0',uStack_30,x14);
  fiat_subborrowx_u64(&stack0xffffffffffffff60,(fiat_uint1 *)((long)&x18 + 7),x16._7_1_,uStack_48,0)
  ;
  fiat_subborrowx_u64(&stack0xffffffffffffff50,(fiat_uint1 *)((long)&x20 + 7),x18._7_1_,uStack_60,0)
  ;
  fiat_subborrowx_u64(&stack0xffffffffffffff40,(fiat_uint1 *)((long)&x22 + 7),x20._7_1_,uStack_78,0)
  ;
  fiat_cmovznz_u64(&x23,x22._7_1_,0,0x26);
  fiat_subborrowx_u64(&stack0xffffffffffffff28,&local_d9,'\0',uStack_90,x23);
  *arg1_local = uStack_d8;
  arg1_local[1] = uStack_a0;
  arg1_local[2] = uStack_b0;
  arg1_local[3] = uStack_c0;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void fe4_sub(uint64_t out1[4], const uint64_t arg1[4], const uint64_t arg2[4]) {
  uint64_t x1;
  uint64_t x2;
  fiat_uint1 x3;
  uint64_t x4;
  uint64_t x5;
  fiat_uint1 x6;
  uint64_t x7;
  uint64_t x8;
  fiat_uint1 x9;
  uint64_t x10;
  uint64_t x11;
  fiat_uint1 x12;
  uint64_t x13;
  uint64_t x14;
  fiat_uint1 x15;
  uint64_t x16;
  fiat_uint1 x17;
  uint64_t x18;
  fiat_uint1 x19;
  uint64_t x20;
  fiat_uint1 x21;
  uint64_t x22;
  uint64_t x23;
  fiat_uint1 x24;
  x1 = (arg2[0]);
  fiat_subborrowx_u64(&x2, &x3, 0x0, (arg1[0]), x1);
  x4 = (arg2[1]);
  fiat_subborrowx_u64(&x5, &x6, x3, (arg1[1]), x4);
  x7 = (arg2[2]);
  fiat_subborrowx_u64(&x8, &x9, x6, (arg1[2]), x7);
  x10 = (arg2[3]);
  fiat_subborrowx_u64(&x11, &x12, x9, (arg1[3]), x10);
  fiat_cmovznz_u64(&x13, x12, 0x0, UINT8_C(0x26)); // NOTE: clang 14 for Zen 2 uses sbb, and
  fiat_subborrowx_u64(&x14, &x15, 0x0, x2, x13);
  fiat_subborrowx_u64(&x16, &x17, x15, x5, 0x0);
  fiat_subborrowx_u64(&x18, &x19, x17, x8, 0x0);
  fiat_subborrowx_u64(&x20, &x21, x19, x11, 0x0);
  fiat_cmovznz_u64(&x22, x21, 0x0, UINT8_C(0x26)); // NOTE: clang 14 for Zen 2 uses sbb, and
  fiat_subborrowx_u64(&x23, &x24, 0x0, x14, x22);
  out1[0] = x23;
  out1[1] = x16;
  out1[2] = x18;
  out1[3] = x20;
}